

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

size_t EntityRelationTask::predict_entity
                 (search *sch,example *ex,v_array<unsigned_long> *param_3,ptag my_tag,bool isLdf)

{
  uint uVar1;
  action aVar2;
  task_data *ptVar3;
  predictor *ppVar4;
  polylabel *this;
  wclass *pwVar5;
  predictor *a_00;
  search *in_RDI;
  byte in_R8B;
  float loss;
  label *lab;
  uint32_t a;
  v_array<unsigned_int> star_labels;
  size_t prediction;
  task_data *my_task_data;
  undefined4 in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  action in_stack_fffffffffffffc44;
  example *in_stack_fffffffffffffc48;
  example *in_stack_fffffffffffffc50;
  example *in_stack_fffffffffffffc58;
  predictor *in_stack_fffffffffffffc60;
  uint64_t in_stack_fffffffffffffc88;
  uint64_t in_stack_fffffffffffffc90;
  uint in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined8 in_stack_fffffffffffffca0;
  ptag in_stack_fffffffffffffce4;
  search *in_stack_fffffffffffffce8;
  predictor *in_stack_fffffffffffffcf0;
  predictor *in_stack_fffffffffffffd18;
  uint local_150;
  ulong local_30;
  
  ptVar3 = Search::search::get_task_data<EntityRelationTask::task_data>(in_RDI);
  if ((ptVar3->allow_skip & 1U) == 0) {
    if ((in_R8B & 1) == 0) {
      ppVar4 = (predictor *)&stack0xfffffffffffffcd8;
      Search::predictor::predictor
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      Search::predictor::set_input
                ((predictor *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 (example *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      a_00 = Search::predictor::set_oracle
                       ((predictor *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        (action)in_stack_fffffffffffffc3c);
      ppVar4 = Search::predictor::set_allowed(ppVar4,(v_array<unsigned_int> *)a_00);
      Search::predictor::set_learner_id(ppVar4,0);
      uVar1 = Search::predictor::predict(in_stack_fffffffffffffd18);
      in_stack_fffffffffffffc44 = uVar1;
      Search::predictor::~predictor((predictor *)CONCAT44(uVar1,in_stack_fffffffffffffc40));
    }
    else {
      for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
        VW::copy_example_data
                  (SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0),in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc50);
        update_example_indicies
                  (SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0),
                   (example *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                   in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        this = &ptVar3->ldf_entity[local_150].l;
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&this->simple,0);
        pwVar5->x = 0.0;
        in_stack_fffffffffffffc98 = local_150;
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&this->simple,0);
        pwVar5->class_index = in_stack_fffffffffffffc98;
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&this->simple,0);
        pwVar5->partial_prediction = 0.0;
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&this->simple,0);
        pwVar5->wap_value = 0.0;
      }
      Search::predictor::predictor
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      Search::predictor::set_input
                ((predictor *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                 CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
      ppVar4 = Search::predictor::set_oracle
                         ((predictor *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40)
                          ,(action)in_stack_fffffffffffffc3c);
      Search::predictor::set_learner_id(ppVar4,1);
      aVar2 = Search::predictor::predict(in_stack_fffffffffffffd18);
      uVar1 = aVar2 + 1;
      Search::predictor::~predictor
                ((predictor *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    }
  }
  else {
    v_init<unsigned_int>();
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (uint *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (uint *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (uint *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    Search::predictor::predictor
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
    Search::predictor::set_input
              ((predictor *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (example *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    Search::predictor::set_oracle
              (in_stack_fffffffffffffc60,(v_array<unsigned_int> *)in_stack_fffffffffffffc58);
    ppVar4 = Search::predictor::set_allowed
                       (in_stack_fffffffffffffc60,(v_array<unsigned_int> *)in_stack_fffffffffffffc58
                       );
    Search::predictor::set_learner_id(ppVar4,1);
    uVar1 = Search::predictor::predict(in_stack_fffffffffffffd18);
    Search::predictor::~predictor
              ((predictor *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    v_array<unsigned_int>::pop(&ptVar3->y_allowed_entity);
  }
  local_30 = (ulong)uVar1;
  Search::search::loss
            ((search *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
             in_stack_fffffffffffffc3c);
  return local_30;
}

Assistant:

size_t predict_entity(
    Search::search& sch, example* ex, v_array<size_t>& /*predictions*/, ptag my_tag, bool isLdf = false)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    my_task_data->y_allowed_entity.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(my_task_data->y_allowed_entity)
                     .set_learner_id(1)
                     .predict();
    my_task_data->y_allowed_entity.pop();
  }
  else
  {
    if (isLdf)
    {
      for (uint32_t a = 0; a < 4; a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_entity[a], ex);
        update_example_indicies(true, &my_task_data->ldf_entity[a], 28904713, 4832917 * (uint64_t)(a + 1));
        CS::label& lab = my_task_data->ldf_entity[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = a;
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
      }
      prediction = Search::predictor(sch, my_tag)
                       .set_input(my_task_data->ldf_entity, 4)
                       .set_oracle(ex->l.multi.label - 1)
                       .set_learner_id(1)
                       .predict() +
          1;
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(my_task_data->y_allowed_entity)
                       .set_learner_id(0)
                       .predict();
    }
  }

  // record loss
  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
    loss = my_task_data->entity_cost;
  sch.loss(loss);
  return prediction;
}